

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackInterpreter.cpp
# Opt level: O0

void __thiscall Lodtalk::StackInterpreter::interpret(StackInterpreter *this)

{
  StackInterpreter *this_local;
  
  this->extendA = 0;
  this->extendB = 0;
  while (this->pc != 0) {
    this->currentOpcode = this->nextOpcode;
    switch(this->currentOpcode) {
    case 0:
      interpretPushReceiverVariableShort(this,0);
      break;
    case 1:
      interpretPushReceiverVariableShort(this,1);
      break;
    case 2:
      interpretPushReceiverVariableShort(this,2);
      break;
    case 3:
      interpretPushReceiverVariableShort(this,3);
      break;
    case 4:
      interpretPushReceiverVariableShort(this,4);
      break;
    case 5:
      interpretPushReceiverVariableShort(this,5);
      break;
    case 6:
      interpretPushReceiverVariableShort(this,6);
      break;
    case 7:
      interpretPushReceiverVariableShort(this,7);
      break;
    case 8:
      interpretPushReceiverVariableShort(this,8);
      break;
    case 9:
      interpretPushReceiverVariableShort(this,9);
      break;
    case 10:
      interpretPushReceiverVariableShort(this,10);
      break;
    case 0xb:
      interpretPushReceiverVariableShort(this,0xb);
      break;
    case 0xc:
      interpretPushReceiverVariableShort(this,0xc);
      break;
    case 0xd:
      interpretPushReceiverVariableShort(this,0xd);
      break;
    case 0xe:
      interpretPushReceiverVariableShort(this,0xe);
      break;
    case 0xf:
      interpretPushReceiverVariableShort(this,0xf);
      break;
    case 0x10:
      interpretPushLiteralVariableShort(this,0);
      break;
    case 0x11:
      interpretPushLiteralVariableShort(this,1);
      break;
    case 0x12:
      interpretPushLiteralVariableShort(this,2);
      break;
    case 0x13:
      interpretPushLiteralVariableShort(this,3);
      break;
    case 0x14:
      interpretPushLiteralVariableShort(this,4);
      break;
    case 0x15:
      interpretPushLiteralVariableShort(this,5);
      break;
    case 0x16:
      interpretPushLiteralVariableShort(this,6);
      break;
    case 0x17:
      interpretPushLiteralVariableShort(this,7);
      break;
    case 0x18:
      interpretPushLiteralVariableShort(this,8);
      break;
    case 0x19:
      interpretPushLiteralVariableShort(this,9);
      break;
    case 0x1a:
      interpretPushLiteralVariableShort(this,10);
      break;
    case 0x1b:
      interpretPushLiteralVariableShort(this,0xb);
      break;
    case 0x1c:
      interpretPushLiteralVariableShort(this,0xc);
      break;
    case 0x1d:
      interpretPushLiteralVariableShort(this,0xd);
      break;
    case 0x1e:
      interpretPushLiteralVariableShort(this,0xe);
      break;
    case 0x1f:
      interpretPushLiteralVariableShort(this,0xf);
      break;
    case 0x20:
      interpretPushLiteralShort(this,0);
      break;
    case 0x21:
      interpretPushLiteralShort(this,1);
      break;
    case 0x22:
      interpretPushLiteralShort(this,2);
      break;
    case 0x23:
      interpretPushLiteralShort(this,3);
      break;
    case 0x24:
      interpretPushLiteralShort(this,4);
      break;
    case 0x25:
      interpretPushLiteralShort(this,5);
      break;
    case 0x26:
      interpretPushLiteralShort(this,6);
      break;
    case 0x27:
      interpretPushLiteralShort(this,7);
      break;
    case 0x28:
      interpretPushLiteralShort(this,8);
      break;
    case 0x29:
      interpretPushLiteralShort(this,9);
      break;
    case 0x2a:
      interpretPushLiteralShort(this,10);
      break;
    case 0x2b:
      interpretPushLiteralShort(this,0xb);
      break;
    case 0x2c:
      interpretPushLiteralShort(this,0xc);
      break;
    case 0x2d:
      interpretPushLiteralShort(this,0xd);
      break;
    case 0x2e:
      interpretPushLiteralShort(this,0xe);
      break;
    case 0x2f:
      interpretPushLiteralShort(this,0xf);
      break;
    case 0x30:
      interpretPushLiteralShort(this,0x10);
      break;
    case 0x31:
      interpretPushLiteralShort(this,0x11);
      break;
    case 0x32:
      interpretPushLiteralShort(this,0x12);
      break;
    case 0x33:
      interpretPushLiteralShort(this,0x13);
      break;
    case 0x34:
      interpretPushLiteralShort(this,0x14);
      break;
    case 0x35:
      interpretPushLiteralShort(this,0x15);
      break;
    case 0x36:
      interpretPushLiteralShort(this,0x16);
      break;
    case 0x37:
      interpretPushLiteralShort(this,0x17);
      break;
    case 0x38:
      interpretPushLiteralShort(this,0x18);
      break;
    case 0x39:
      interpretPushLiteralShort(this,0x19);
      break;
    case 0x3a:
      interpretPushLiteralShort(this,0x1a);
      break;
    case 0x3b:
      interpretPushLiteralShort(this,0x1b);
      break;
    case 0x3c:
      interpretPushLiteralShort(this,0x1c);
      break;
    case 0x3d:
      interpretPushLiteralShort(this,0x1d);
      break;
    case 0x3e:
      interpretPushLiteralShort(this,0x1e);
      break;
    case 0x3f:
      interpretPushLiteralShort(this,0x1f);
      break;
    case 0x40:
      interpretPushTempShort(this,0);
      break;
    case 0x41:
      interpretPushTempShort(this,1);
      break;
    case 0x42:
      interpretPushTempShort(this,2);
      break;
    case 0x43:
      interpretPushTempShort(this,3);
      break;
    case 0x44:
      interpretPushTempShort(this,4);
      break;
    case 0x45:
      interpretPushTempShort(this,5);
      break;
    case 0x46:
      interpretPushTempShort(this,6);
      break;
    case 0x47:
      interpretPushTempShort(this,7);
      break;
    case 0x48:
      interpretPushTempShort(this,8);
      break;
    case 0x49:
      interpretPushTempShort(this,9);
      break;
    case 0x4a:
      interpretPushTempShort(this,10);
      break;
    case 0x4b:
      interpretPushTempShort(this,0xb);
      break;
    case 0x4c:
      interpretPushReceiver(this);
      break;
    case 0x4d:
      interpretPushTrue(this);
      break;
    case 0x4e:
      interpretPushFalse(this);
      break;
    case 0x4f:
      interpretPushNil(this);
      break;
    case 0x50:
      interpretPushZero(this);
      break;
    case 0x51:
      interpretPushOne(this);
      break;
    case 0x52:
      interpretPushThisContext(this);
      break;
    case 0x53:
      interpretDuplicateStackTop(this);
      break;
    default:
      errorFormat(this,"unsupported bytecode %d",(ulong)(uint)this->currentOpcode);
      break;
    case 0x58:
      interpretReturnReceiver(this);
      break;
    case 0x59:
      interpretReturnTrue(this);
      break;
    case 0x5a:
      interpretReturnFalse(this);
      break;
    case 0x5b:
      interpretReturnNil(this);
      break;
    case 0x5c:
      interpretReturnTop(this);
      break;
    case 0x5d:
      interpretBlockReturnNil(this);
      break;
    case 0x5e:
      interpretBlockReturnTop(this);
      break;
    case 0x5f:
      interpretNop(this);
      break;
    case 0x60:
      interpretSpecialMessageAdd(this);
      break;
    case 0x61:
      interpretSpecialMessageMinus(this);
      break;
    case 0x62:
      interpretSpecialMessageLessThan(this);
      break;
    case 99:
      interpretSpecialMessageGreaterThan(this);
      break;
    case 100:
      interpretSpecialMessageLessEqual(this);
      break;
    case 0x65:
      interpretSpecialMessageGreaterEqual(this);
      break;
    case 0x66:
      interpretSpecialMessageEqual(this);
      break;
    case 0x67:
      interpretSpecialMessageNotEqual(this);
      break;
    case 0x68:
      interpretSpecialMessageMultiply(this);
      break;
    case 0x69:
      interpretSpecialMessageDivide(this);
      break;
    case 0x6a:
      interpretSpecialMessageRemainder(this);
      break;
    case 0x6b:
      interpretSpecialMessageMakePoint(this);
      break;
    case 0x6c:
      interpretSpecialMessageBitShift(this);
      break;
    case 0x6d:
      interpretSpecialMessageIntegerDivision(this);
      break;
    case 0x6e:
      interpretSpecialMessageBitAnd(this);
      break;
    case 0x6f:
      interpretSpecialMessageBitOr(this);
      break;
    case 0x70:
      interpretSpecialMessageAt(this);
      break;
    case 0x71:
      interpretSpecialMessageAtPut(this);
      break;
    case 0x72:
      interpretSpecialMessageSize(this);
      break;
    case 0x73:
      interpretSpecialMessageNext(this);
      break;
    case 0x74:
      interpretSpecialMessageNextPut(this);
      break;
    case 0x75:
      interpretSpecialMessageAtEnd(this);
      break;
    case 0x76:
      interpretSpecialMessageIdentityEqual(this);
      break;
    case 0x77:
      interpretSpecialMessageClass(this);
      break;
    case 0x79:
      interpretSpecialMessageValue(this);
      break;
    case 0x7a:
      interpretSpecialMessageValueArg(this);
      break;
    case 0x7b:
      interpretSpecialMessageDo(this);
      break;
    case 0x7c:
      interpretSpecialMessageNew(this);
      break;
    case 0x7d:
      interpretSpecialMessageNewArray(this);
      break;
    case 0x7e:
      interpretSpecialMessageX(this);
      break;
    case 0x7f:
      interpretSpecialMessageY(this);
      break;
    case 0x80:
      interpretSendShortArgs0(this,0);
      break;
    case 0x81:
      interpretSendShortArgs0(this,1);
      break;
    case 0x82:
      interpretSendShortArgs0(this,2);
      break;
    case 0x83:
      interpretSendShortArgs0(this,3);
      break;
    case 0x84:
      interpretSendShortArgs0(this,4);
      break;
    case 0x85:
      interpretSendShortArgs0(this,5);
      break;
    case 0x86:
      interpretSendShortArgs0(this,6);
      break;
    case 0x87:
      interpretSendShortArgs0(this,7);
      break;
    case 0x88:
      interpretSendShortArgs0(this,8);
      break;
    case 0x89:
      interpretSendShortArgs0(this,9);
      break;
    case 0x8a:
      interpretSendShortArgs0(this,10);
      break;
    case 0x8b:
      interpretSendShortArgs0(this,0xb);
      break;
    case 0x8c:
      interpretSendShortArgs0(this,0xc);
      break;
    case 0x8d:
      interpretSendShortArgs0(this,0xd);
      break;
    case 0x8e:
      interpretSendShortArgs0(this,0xe);
      break;
    case 0x8f:
      interpretSendShortArgs0(this,0xf);
      break;
    case 0x90:
      interpretSendShortArgs1(this,0);
      break;
    case 0x91:
      interpretSendShortArgs1(this,1);
      break;
    case 0x92:
      interpretSendShortArgs1(this,2);
      break;
    case 0x93:
      interpretSendShortArgs1(this,3);
      break;
    case 0x94:
      interpretSendShortArgs1(this,4);
      break;
    case 0x95:
      interpretSendShortArgs1(this,5);
      break;
    case 0x96:
      interpretSendShortArgs1(this,6);
      break;
    case 0x97:
      interpretSendShortArgs1(this,7);
      break;
    case 0x98:
      interpretSendShortArgs1(this,8);
      break;
    case 0x99:
      interpretSendShortArgs1(this,9);
      break;
    case 0x9a:
      interpretSendShortArgs1(this,10);
      break;
    case 0x9b:
      interpretSendShortArgs1(this,0xb);
      break;
    case 0x9c:
      interpretSendShortArgs1(this,0xc);
      break;
    case 0x9d:
      interpretSendShortArgs1(this,0xd);
      break;
    case 0x9e:
      interpretSendShortArgs1(this,0xe);
      break;
    case 0x9f:
      interpretSendShortArgs1(this,0xf);
      break;
    case 0xa0:
      interpretSendShortArgs2(this,0);
      break;
    case 0xa1:
      interpretSendShortArgs2(this,1);
      break;
    case 0xa2:
      interpretSendShortArgs2(this,2);
      break;
    case 0xa3:
      interpretSendShortArgs2(this,3);
      break;
    case 0xa4:
      interpretSendShortArgs2(this,4);
      break;
    case 0xa5:
      interpretSendShortArgs2(this,5);
      break;
    case 0xa6:
      interpretSendShortArgs2(this,6);
      break;
    case 0xa7:
      interpretSendShortArgs2(this,7);
      break;
    case 0xa8:
      interpretSendShortArgs2(this,8);
      break;
    case 0xa9:
      interpretSendShortArgs2(this,9);
      break;
    case 0xaa:
      interpretSendShortArgs2(this,10);
      break;
    case 0xab:
      interpretSendShortArgs2(this,0xb);
      break;
    case 0xac:
      interpretSendShortArgs2(this,0xc);
      break;
    case 0xad:
      interpretSendShortArgs2(this,0xd);
      break;
    case 0xae:
      interpretSendShortArgs2(this,0xe);
      break;
    case 0xaf:
      interpretSendShortArgs2(this,0xf);
      break;
    case 0xb0:
      interpretJumpShort(this,0);
      break;
    case 0xb1:
      interpretJumpShort(this,1);
      break;
    case 0xb2:
      interpretJumpShort(this,2);
      break;
    case 0xb3:
      interpretJumpShort(this,3);
      break;
    case 0xb4:
      interpretJumpShort(this,4);
      break;
    case 0xb5:
      interpretJumpShort(this,5);
      break;
    case 0xb6:
      interpretJumpShort(this,6);
      break;
    case 0xb7:
      interpretJumpShort(this,7);
      break;
    case 0xb8:
      interpretJumpOnTrueShort(this,0);
      break;
    case 0xb9:
      interpretJumpOnTrueShort(this,1);
      break;
    case 0xba:
      interpretJumpOnTrueShort(this,2);
      break;
    case 0xbb:
      interpretJumpOnTrueShort(this,3);
      break;
    case 0xbc:
      interpretJumpOnTrueShort(this,4);
      break;
    case 0xbd:
      interpretJumpOnTrueShort(this,5);
      break;
    case 0xbe:
      interpretJumpOnTrueShort(this,6);
      break;
    case 0xbf:
      interpretJumpOnTrueShort(this,7);
      break;
    case 0xc0:
      interpretJumpOnFalseShort(this,0);
      break;
    case 0xc1:
      interpretJumpOnFalseShort(this,1);
      break;
    case 0xc2:
      interpretJumpOnFalseShort(this,2);
      break;
    case 0xc3:
      interpretJumpOnFalseShort(this,3);
      break;
    case 0xc4:
      interpretJumpOnFalseShort(this,4);
      break;
    case 0xc5:
      interpretJumpOnFalseShort(this,5);
      break;
    case 0xc6:
      interpretJumpOnFalseShort(this,6);
      break;
    case 199:
      interpretJumpOnFalseShort(this,7);
      break;
    case 200:
      interpretPopStoreReceiverVariableShort(this,0);
      break;
    case 0xc9:
      interpretPopStoreReceiverVariableShort(this,1);
      break;
    case 0xca:
      interpretPopStoreReceiverVariableShort(this,2);
      break;
    case 0xcb:
      interpretPopStoreReceiverVariableShort(this,3);
      break;
    case 0xcc:
      interpretPopStoreReceiverVariableShort(this,4);
      break;
    case 0xcd:
      interpretPopStoreReceiverVariableShort(this,5);
      break;
    case 0xce:
      interpretPopStoreReceiverVariableShort(this,6);
      break;
    case 0xcf:
      interpretPopStoreReceiverVariableShort(this,7);
      break;
    case 0xd0:
      interpretPopStoreTemporalVariableShort(this,0);
      break;
    case 0xd1:
      interpretPopStoreTemporalVariableShort(this,1);
      break;
    case 0xd2:
      interpretPopStoreTemporalVariableShort(this,2);
      break;
    case 0xd3:
      interpretPopStoreTemporalVariableShort(this,3);
      break;
    case 0xd4:
      interpretPopStoreTemporalVariableShort(this,4);
      break;
    case 0xd5:
      interpretPopStoreTemporalVariableShort(this,5);
      break;
    case 0xd6:
      interpretPopStoreTemporalVariableShort(this,6);
      break;
    case 0xd7:
      interpretPopStoreTemporalVariableShort(this,7);
      break;
    case 0xd8:
      interpretPopStackTop(this);
      break;
    case 0xe0:
      interpretExtendA(this);
      break;
    case 0xe1:
      interpretExtendB(this);
      break;
    case 0xe2:
      interpretPushReceiverVariable(this);
      break;
    case 0xe3:
      interpretPushLiteralVariable(this);
      break;
    case 0xe4:
      interpretPushLiteral(this);
      break;
    case 0xe5:
      interpretPushTemporary(this);
      break;
    case 0xe6:
      interpretPushNTemps(this);
      break;
    case 0xe7:
      interpretPushInteger(this);
      break;
    case 0xe8:
      interpretPushCharacter(this);
      break;
    case 0xe9:
      interpretPushArrayWithElements(this);
      break;
    case 0xea:
      interpretSend(this);
      break;
    case 0xeb:
      interpretSuperSend(this);
      break;
    case 0xec:
      interpretTrapOnBehavior(this);
      break;
    case 0xed:
      interpretJump(this);
      break;
    case 0xee:
      interpretJumpOnTrue(this);
      break;
    case 0xef:
      interpretJumpOnFalse(this);
      break;
    case 0xf0:
      interpretPopStoreReceiverVariable(this);
      break;
    case 0xf1:
      interpretPopStoreLiteralVariable(this);
      break;
    case 0xf2:
      interpretPopStoreTemporalVariable(this);
      break;
    case 0xf3:
      interpretStoreReceiverVariable(this);
      break;
    case 0xf4:
      interpretStoreLiteralVariable(this);
      break;
    case 0xf5:
      interpretStoreTemporalVariable(this);
      break;
    case 0xf8:
      interpretCallPrimitive(this);
      break;
    case 0xfa:
      interpretPushClosure(this);
      break;
    case 0xfb:
      interpretPushTemporaryInVector(this);
      break;
    case 0xfc:
      interpretStoreTemporalInVector(this);
      break;
    case 0xfd:
      interpretPopStoreTemporalInVector(this);
    }
  }
  return;
}

Assistant:

void StackInterpreter::interpret()
{
	// Reset the extensions values
	extendA = 0;
	extendB = 0;
    //printf("interpret begin %d\n", pc);
	while(pc != 0)
	{
		currentOpcode = nextOpcode;
        //printf("interpret %03d. %s\n", currentOpcode, getSistaBytecodeName(currentOpcode).c_str());
		switch(currentOpcode)
		{
#define BYTECODE_DISPATCH_NAME(name) interpret ## name
#include "BytecodeSetDispatchTable.inc"
#undef BYTECODE_DISPATCH_NAME

		default:
			errorFormat("unsupported bytecode %d", currentOpcode);
		}
	}
}